

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioFunc.c
# Opt level: O0

int Mio_LibraryParseFormulas(Mio_Library_t *pLib)

{
  int iVar1;
  Mio_Gate_t *local_20;
  Mio_Gate_t *pGate;
  Mio_Library_t *pLib_local;
  
  pLib->nGates = 0;
  for (local_20 = Mio_LibraryReadGates(pLib); local_20 != (Mio_Gate_t *)0x0;
      local_20 = Mio_GateReadNext(local_20)) {
    pLib->nGates = pLib->nGates + 1;
  }
  local_20 = Mio_LibraryReadGates(pLib);
  while( true ) {
    if (local_20 == (Mio_Gate_t *)0x0) {
      return 0;
    }
    iVar1 = Mio_GateParseFormula(local_20);
    if (iVar1 != 0) break;
    local_20 = Mio_GateReadNext(local_20);
  }
  return 1;
}

Assistant:

int Mio_LibraryParseFormulas( Mio_Library_t * pLib )
{
    Mio_Gate_t * pGate;

    // count the gates
    pLib->nGates = 0;
    Mio_LibraryForEachGate( pLib, pGate )
        pLib->nGates++;        

    // for each gate, derive its function
    Mio_LibraryForEachGate( pLib, pGate )
        if ( Mio_GateParseFormula( pGate ) )
            return 1;
    return 0;
}